

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O1

void __thiscall wallet::RecordsPage::Unserialize<AutoFile>(RecordsPage *this,AutoFile *s)

{
  iterator __position;
  undefined4 uVar1;
  runtime_error *this_00;
  RecordsPage *in_RCX;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  uint uVar5;
  long lVar6;
  int64_t offset;
  long in_FS_OFFSET;
  uint16_t obj;
  RecordHeader rec_hdr;
  uint16_t index;
  long local_78;
  DataRecord local_60;
  RecordHeader local_40;
  unsigned_short local_3a;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_header).entries != 0) {
    local_78 = 0x1a;
    uVar5 = 0;
    lVar3 = 0x19;
    lVar6 = -0x1c;
    do {
      AutoFile::read(s,(int)&local_60,(void *)0x2,(size_t)in_RCX);
      local_3a = local_60.m_header.len;
      if ((this->m_header).other_endian == true) {
        local_3a = local_60.m_header.len << 8 | local_60.m_header.len >> 8;
      }
      __position._M_current =
           (this->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
           _M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_short,std::allocator<unsigned_short>>::
        _M_realloc_insert<unsigned_short_const&>
                  ((vector<unsigned_short,std::allocator<unsigned_short>> *)&this->indexes,
                   __position,&local_3a);
      }
      else {
        *__position._M_current = local_3a;
        (this->indexes).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      uVar2 = (ulong)local_3a;
      if ((long)(lVar6 + uVar2) < 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Data record position not in page");
LAB_0057797a:
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        goto LAB_005779ed;
      }
      local_78 = local_78 + 2;
      AutoFile::ignore(s,lVar6 + uVar2);
      local_40.other_endian = (this->m_header).other_endian;
      RecordHeader::Unserialize<AutoFile>(&local_40,s);
      if (local_40.type == OVERFLOW_DATA) {
        offset = -0xc - (uVar2 - local_78);
        local_60.m_header.other_endian = local_40.other_endian;
        local_60.m_header._5_1_ = local_40._5_1_;
        local_60.m_header.len = local_40.len;
        local_60.m_header.type = local_40.type;
        local_60.m_header.deleted = local_40.deleted;
        OverflowRecord::Unserialize<AutoFile>((OverflowRecord *)&local_60,s);
        std::
        vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
        ::emplace_back<wallet::OverflowRecord&>
                  ((vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
                    *)&this->records,(OverflowRecord *)&local_60);
      }
      else {
        if (local_40.type != KEYDATA) {
          this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error(this_00,"Unknown record type in records page");
          goto LAB_0057797a;
        }
        local_60.m_header.other_endian = local_40.other_endian;
        local_60.m_header._5_1_ = local_40._5_1_;
        local_60.m_header.len = local_40.len;
        local_60.m_header.type = local_40.type;
        local_60.m_header.deleted = local_40.deleted;
        uVar1 = local_60.m_header._0_4_;
        local_60.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_60.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_60.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_60.m_header.len = local_40.len;
        uVar4 = (ulong)local_60.m_header.len;
        local_60.m_header._0_4_ = uVar1;
        std::vector<std::byte,_std::allocator<std::byte>_>::resize(&local_60.data,uVar4);
        AutoFile::read(s,(int)local_60.data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start,
                       local_60.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                       _M_impl.super__Vector_impl_data._M_finish +
                       -(long)local_60.data.
                              super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                              super__Vector_impl_data._M_start,(size_t)in_RCX);
        std::
        vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
        ::emplace_back<wallet::DataRecord&>
                  ((vector<std::variant<wallet::DataRecord,wallet::OverflowRecord>,std::allocator<std::variant<wallet::DataRecord,wallet::OverflowRecord>>>
                    *)&this->records,&local_60);
        uVar4 = (ulong)local_40.len;
        if (local_60.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_60.data.super__Vector_base<std::byte,_std::allocator<std::byte>_>.
                          _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.data.
                                super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_60.data.
                                super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
        offset = lVar3 - (uVar2 + uVar4);
      }
      AutoFile::seek(s,offset,1);
      uVar5 = uVar5 + 1;
      lVar3 = lVar3 + 2;
      lVar6 = lVar6 + -2;
      in_RCX = this;
    } while (uVar5 < (this->m_header).entries);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_005779ed:
  __stack_chk_fail();
}

Assistant:

void Unserialize(Stream& s)
    {
        // Current position within the page
        int64_t pos = PageHeader::SIZE;

        // Get the items
        for (uint32_t i = 0; i < m_header.entries; ++i) {
            // Get the index
            uint16_t index;
            s >> index;
            if (m_header.other_endian) {
                index = internal_bswap_16(index);
            }
            indexes.push_back(index);
            pos += sizeof(uint16_t);

            // Go to the offset from the index
            int64_t to_jump = index - pos;
            if (to_jump < 0) {
                throw std::runtime_error("Data record position not in page");
            }
            s.ignore(to_jump);

            // Read the record
            RecordHeader rec_hdr(m_header.other_endian);
            s >> rec_hdr;
            to_jump += RecordHeader::SIZE;

            switch (rec_hdr.type) {
            case RecordType::KEYDATA: {
                DataRecord record(rec_hdr);
                s >> record;
                records.emplace_back(record);
                to_jump += rec_hdr.len;
                break;
            }
            case RecordType::OVERFLOW_DATA: {
                OverflowRecord record(rec_hdr);
                s >> record;
                records.emplace_back(record);
                to_jump += OverflowRecord::SIZE;
                break;
            }
            default:
                throw std::runtime_error("Unknown record type in records page");
            }

            // Go back to the indexes
            s.seek(-to_jump, SEEK_CUR);
        }
    }